

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomcmd_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *peVar1;
  int iVar2;
  matches *pmVar3;
  match *pmVar4;
  
  if ((((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_EXPR)) &&
      (peVar1 = ctx->atoms[spos]->expr, peVar1->type == EASM_EXPR_LABEL)) &&
     (iVar2 = strcmp(peVar1->str,(char *)v), iVar2 == 0)) {
    pmVar3 = (matches *)calloc(0x10,1);
    pmVar3->mmax = 0x10;
    pmVar4 = (match *)malloc(0xb80);
    pmVar3->m = pmVar4;
    pmVar3->mnum = 1;
    *(undefined8 *)pmVar4 = 0;
    pmVar4->a[0] = 0;
    pmVar4->a[1] = 0;
    pmVar4->m[0] = 0;
    pmVar4->m[1] = 0;
    pmVar4->lpos = spos + 1;
    memset(&pmVar4->field_0x2c,0,0x8c);
    return pmVar3;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomcmd_a APROTO {
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	if (e->type == EASM_EXPR_LABEL && !strcmp(e->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}